

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestArray.cpp
# Opt level: O0

void testArray(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  usize uVar4;
  int *piVar5;
  int local_50 [6];
  undefined1 local_38 [8];
  Array<int> emptyArray;
  Array<int> myArray;
  
  Array<int>::Array((Array<int> *)&emptyArray._capacity);
  Array<int>::Array((Array<int> *)local_38);
  Array<int>::swap((Array<int> *)&emptyArray._capacity,(Array<int> *)local_38);
  bVar2 = Array<int>::isEmpty((Array<int> *)&emptyArray._capacity);
  if ((!bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0xc,"myArray.isEmpty()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uVar4 = Array<int>::size((Array<int> *)&emptyArray._capacity);
  if ((uVar4 != 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0xd,"myArray.size() == 0"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50[2] = 0x7b;
  piVar5 = Array<int>::append((Array<int> *)&emptyArray._capacity,local_50 + 2);
  if ((*piVar5 != 0x7b) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0xe,"myArray.append(123) == 123"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50[1] = 0x7c;
  piVar5 = Array<int>::append((Array<int> *)&emptyArray._capacity,local_50 + 1);
  if ((*piVar5 != 0x7c) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0xf,"myArray.append(124) == 124"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50[0] = 0x7d;
  piVar5 = Array<int>::append((Array<int> *)&emptyArray._capacity,local_50);
  if ((*piVar5 != 0x7d) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0x10,"myArray.append(125) == 125"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = Array<int>::isEmpty((Array<int> *)&emptyArray._capacity);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0x11,"!myArray.isEmpty()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uVar4 = Array<int>::size((Array<int> *)&emptyArray._capacity);
  if ((uVar4 != 3) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0x12,"myArray.size() == 3"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Array<int>::clear((Array<int> *)&emptyArray._capacity);
  bVar2 = Array<int>::isEmpty((Array<int> *)&emptyArray._capacity);
  if ((!bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0x16,"myArray.isEmpty()"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uVar4 = Array<int>::size((Array<int> *)&emptyArray._capacity);
  if ((uVar4 != 0) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestArray.cpp"
                            ,0x17,"myArray.size() == 0"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Array<int>::~Array((Array<int> *)local_38);
  Array<int>::~Array((Array<int> *)&emptyArray._capacity);
  return;
}

Assistant:

void testArray()
{
  // test append
  Array<int> myArray;
  Array<int> emptyArray;
  myArray.swap(emptyArray);
  ASSERT(myArray.isEmpty());
  ASSERT(myArray.size() == 0);
  ASSERT(myArray.append(123) == 123);
  ASSERT(myArray.append(124) == 124);
  ASSERT(myArray.append(125) == 125);
  ASSERT(!myArray.isEmpty());
  ASSERT(myArray.size() == 3);

  // tets clear
  myArray.clear();
  ASSERT(myArray.isEmpty());
  ASSERT(myArray.size() == 0);
}